

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_output_auth
                   (Curl_easy *data,connectdata *conn,char *request,Curl_HttpReq httpreq,char *path,
                   _Bool proxytunnel)

{
  _Bool _Var1;
  auth *authstatus;
  auth *authstatus_00;
  auth *authproxy;
  auth *authhost;
  CURLcode result;
  _Bool proxytunnel_local;
  char *path_local;
  Curl_HttpReq httpreq_local;
  char *request_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  authhost._0_4_ = CURLE_OK;
  authstatus = &(data->state).authhost;
  authstatus_00 = &(data->state).authproxy;
  if (((((*(uint *)&(conn->bits).field_0x4 & 1) == 0) ||
       ((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) == 0)) &&
      ((data->state).aptr.user == (char *)0x0)) && ((data->set).str[0x40] == (char *)0x0)) {
    (data->state).authhost.field_0x18 = (data->state).authhost.field_0x18 & 0xfe | 1;
    (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfe | 1;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if ((authstatus->want != 0) && ((data->state).authhost.picked == 0)) {
      (data->state).authhost.picked = authstatus->want;
    }
    if ((authstatus_00->want != 0) && ((data->state).authproxy.picked == 0)) {
      (data->state).authproxy.picked = authstatus_00->want;
    }
    if (((*(uint *)&(conn->bits).field_0x4 & 1) == 0) ||
       ((*(uint *)&(conn->bits).field_0x4 >> 3 & 1) != (uint)proxytunnel)) {
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfe | 1;
    }
    else {
      authhost._0_4_ = output_auth_headers(data,conn,authstatus_00,request,path,true);
      if ((CURLcode)authhost != CURLE_OK) {
        return (CURLcode)authhost;
      }
    }
    _Var1 = Curl_auth_allowed_to_host(data);
    if ((_Var1) || ((*(uint *)&(conn->bits).field_0x4 >> 0x16 & 1) != 0)) {
      authhost._0_4_ = output_auth_headers(data,conn,authstatus,request,path,false);
    }
    else {
      (data->state).authhost.field_0x18 = (data->state).authhost.field_0x18 & 0xfe | 1;
    }
    if ((((((byte)(data->state).authhost.field_0x18 >> 1 & 1) == 0) ||
         (((data->state).authhost.field_0x18 & 1) != 0)) &&
        ((((byte)(data->state).authproxy.field_0x18 >> 1 & 1) == 0 ||
         (((data->state).authproxy.field_0x18 & 1) != 0)))) ||
       ((httpreq == HTTPREQ_GET || (httpreq == HTTPREQ_HEAD)))) {
      *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffeffff;
    }
    else {
      *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xfffeffff | 0x10000;
    }
    data_local._4_4_ = (CURLcode)authhost;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode
Curl_http_output_auth(struct Curl_easy *data,
                      struct connectdata *conn,
                      const char *request,
                      Curl_HttpReq httpreq,
                      const char *path,
                      bool proxytunnel) /* TRUE if this is the request setting
                                           up the proxy tunnel */
{
  CURLcode result = CURLE_OK;
  struct auth *authhost;
  struct auth *authproxy;

  DEBUGASSERT(data);

  authhost = &data->state.authhost;
  authproxy = &data->state.authproxy;

  if(
#ifndef CURL_DISABLE_PROXY
    (conn->bits.httpproxy && conn->bits.proxy_user_passwd) ||
#endif
     data->state.aptr.user || data->set.str[STRING_BEARER])
    /* continue please */;
  else {
    authhost->done = TRUE;
    authproxy->done = TRUE;
    return CURLE_OK; /* no authentication with no user or password */
  }

  if(authhost->want && !authhost->picked)
    /* The app has selected one or more methods, but none has been picked
       so far by a server round-trip. Then we set the picked one to the
       want one, and if this is one single bit it'll be used instantly. */
    authhost->picked = authhost->want;

  if(authproxy->want && !authproxy->picked)
    /* The app has selected one or more methods, but none has been picked so
       far by a proxy round-trip. Then we set the picked one to the want one,
       and if this is one single bit it'll be used instantly. */
    authproxy->picked = authproxy->want;

#ifndef CURL_DISABLE_PROXY
  /* Send proxy authentication header if needed */
  if(conn->bits.httpproxy &&
     (conn->bits.tunnel_proxy == (bit)proxytunnel)) {
    result = output_auth_headers(data, conn, authproxy, request, path, TRUE);
    if(result)
      return result;
  }
  else
#else
  (void)proxytunnel;
#endif /* CURL_DISABLE_PROXY */
    /* we have no proxy so let's pretend we're done authenticating
       with it */
    authproxy->done = TRUE;

  /* To prevent the user+password to get sent to other than the original host
     due to a location-follow */
  if(Curl_auth_allowed_to_host(data)
#ifndef CURL_DISABLE_NETRC
     || conn->bits.netrc
#endif
    )
    result = output_auth_headers(data, conn, authhost, request, path, FALSE);
  else
    authhost->done = TRUE;

  if(((authhost->multipass && !authhost->done) ||
      (authproxy->multipass && !authproxy->done)) &&
     (httpreq != HTTPREQ_GET) &&
     (httpreq != HTTPREQ_HEAD)) {
    /* Auth is required and we are not authenticated yet. Make a PUT or POST
       with content-length zero as a "probe". */
    conn->bits.authneg = TRUE;
  }
  else
    conn->bits.authneg = FALSE;

  return result;
}